

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
          (QPDFEmbeddedFileDocumentHelper *this,string *name,QPDFFileSpecObjectHelper *fs)

{
  QPDFNameTreeObjectHelper *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_78;
  iterator local_68;
  
  initEmbeddedFiles(this);
  this_00 = (((this->m).
              super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->embedded_files).
            super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_78,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(fs->super_QPDFObjectHelper).super_BaseHandle);
  QPDFNameTreeObjectHelper::insert(&local_68,this_00,name,(QPDFObjectHandle *)&_Stack_78);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_78._M_refcount);
  return;
}

Assistant:

void
QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile(
    std::string const& name, QPDFFileSpecObjectHelper const& fs)
{
    initEmbeddedFiles();
    m->embedded_files->insert(name, fs.getObjectHandle());
}